

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool fmt::v7::detail::dragonbox::divisible_by_power_of_2(uint32_t x,int exp)

{
  uint uVar1;
  
  if (exp < 1) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x6d9,"");
  }
  if (x != 0) {
    uVar1 = 0;
    for (; (x & 1) == 0; x = x >> 1 | 0x80000000) {
      uVar1 = uVar1 + 1;
    }
    return (uint)exp <= uVar1;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
              ,0x6da,"");
}

Assistant:

inline bool divisible_by_power_of_2(uint32_t x, int exp) FMT_NOEXCEPT {
  FMT_ASSERT(exp >= 1, "");
  FMT_ASSERT(x != 0, "");
#ifdef FMT_BUILTIN_CTZ
  return FMT_BUILTIN_CTZ(x) >= exp;
#else
  return exp < num_bits<uint32_t>() && x == ((x >> exp) << exp);
#endif
}